

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall kernel::BlockTreeDB::WriteFlag(BlockTreeDB *this,string *name,bool fValue)

{
  long lVar1;
  bool bVar2;
  undefined1 in_DL;
  undefined8 in_RSI;
  undefined1 fSync;
  uchar *in_RDI;
  long in_FS_OFFSET;
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffc8;
  CDBWrapper *in_stack_ffffffffffffffd0;
  
  fSync = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_pair<unsigned_char_const&,std::__cxx11::string_const&>
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff88);
  bVar2 = ::CDBWrapper::Write<std::pair<unsigned_char,std::__cxx11::string>,unsigned_char>
                    (in_stack_ffffffffffffffd0,
                     (pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(CONCAT17(in_DL,in_stack_ffffffffffffffc8) & 0x1ffffffffffffff |
                        0x3000000000000000),in_RDI,(bool)fSync);
  std::
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::WriteFlag(const std::string& name, bool fValue)
{
    return Write(std::make_pair(DB_FLAG, name), fValue ? uint8_t{'1'} : uint8_t{'0'});
}